

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxBitOp::Resolve(FxBitOp *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  BYTE BVar2;
  PType *pPVar3;
  PString *pPVar4;
  PInt *pPVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  FxExpression *pFVar9;
  FxExpression *pFVar10;
  uint uVar11;
  FScriptPosition *pFVar12;
  uint uVar13;
  FString local_30;
  undefined4 extraout_var_00;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar10 = (this->super_FxBinary).left;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar8 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar8);
  }
  pFVar10 = (this->super_FxBinary).right;
  if (pFVar10 == (FxExpression *)0x0) {
LAB_00528c9d:
    (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  ppFVar1 = &(this->super_FxBinary).right;
  iVar8 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
  pFVar9 = (FxExpression *)CONCAT44(extraout_var_00,iVar8);
  (this->super_FxBinary).right = pFVar9;
  pFVar10 = (this->super_FxBinary).left;
  if ((pFVar10 == (FxExpression *)0x0) || (pFVar9 == (FxExpression *)0x0)) goto LAB_00528c9d;
  pPVar3 = pFVar10->ValueType;
  if ((pPVar3 == (PType *)TypeBool) && (pFVar9->ValueType == pPVar3)) {
    (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
  }
  else {
    cVar6 = (**(code **)(*(long *)&pPVar3->super_PTypeBase + 0x40))(pPVar3);
    if ((cVar6 == '\0') ||
       (iVar8 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar8 == '\0')) {
      pFVar10 = (FxExpression *)0x0;
      FScriptPosition::Message
                (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                 "Incompatible operands for bit operation");
      goto LAB_00528cc5;
    }
    bVar7 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
    if (!bVar7) {
      return (FxExpression *)0x0;
    }
    pFVar10 = (this->super_FxBinary).left;
  }
  iVar8 = (*pFVar10->_vptr_FxExpression[3])();
  if ((char)iVar8 == '\0') {
    return (FxExpression *)this;
  }
  iVar8 = (*(*ppFVar1)->_vptr_FxExpression[3])();
  if ((char)iVar8 == '\0') {
    return (FxExpression *)this;
  }
  pFVar10 = (this->super_FxBinary).left;
  pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
  pFVar12 = &pFVar10[1].ScriptPosition;
  if (pPVar4 == TypeString) {
    FString::AttachToOther(&local_30,&pFVar12->FileName);
  }
  else {
    local_30.Chars = (pFVar12->FileName).Chars;
  }
  BVar2 = (pPVar4->super_PBasicType).super_PType.RegType;
  if (BVar2 == '\x01') {
    uVar11 = (uint)(double)local_30.Chars;
  }
  else {
    uVar11 = 0;
    if (BVar2 == '\0') {
      uVar11 = (uint)local_30.Chars;
    }
  }
  if (pPVar4 == TypeString) {
    FString::~FString(&local_30);
  }
  pPVar4 = (PString *)(*ppFVar1)[1]._vptr_FxExpression;
  pFVar12 = &(*ppFVar1)[1].ScriptPosition;
  if (pPVar4 == TypeString) {
    FString::AttachToOther(&local_30,&pFVar12->FileName);
  }
  else {
    local_30.Chars = (pFVar12->FileName).Chars;
  }
  BVar2 = (pPVar4->super_PBasicType).super_PType.RegType;
  if (BVar2 == '\x01') {
    uVar13 = (uint)(double)local_30.Chars;
  }
  else {
    uVar13 = 0;
    if (BVar2 == '\0') {
      uVar13 = (uint)local_30.Chars;
    }
  }
  if (pPVar4 == TypeString) {
    FString::~FString(&local_30);
  }
  pFVar10 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
  iVar8 = (this->super_FxBinary).Operator;
  if (iVar8 == 0x7c) {
    uVar13 = uVar13 | uVar11;
  }
  else if (iVar8 == 0x26) {
    uVar13 = uVar13 & uVar11;
  }
  else {
    uVar13 = uVar13 ^ uVar11;
    if (iVar8 != 0x5e) {
      uVar13 = 0;
    }
  }
  pFVar10->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition
            (&pFVar10->ScriptPosition,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
  pFVar10->NeedResult = true;
  pFVar10->ExprType = EFX_Constant;
  pFVar10->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
  pPVar5 = TypeSInt32;
  pFVar10[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
  pFVar10->ValueType = (PType *)pPVar5;
  *(uint *)&pFVar10[1].ScriptPosition.FileName.Chars = uVar13;
  pFVar10->isresolved = true;
LAB_00528cc5:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return pFVar10;
}

Assistant:

FxExpression *FxBitOp::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for bit operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == '&'? v1 & v2 : 
			Operator == '|'? v1 | v2 : 
			Operator == '^'? v1 ^ v2 : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}